

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ElemStack::addGlobalPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  PrefMapElem *pPVar2;
  XMLSize_t XVar3;
  bool bVar4;
  uint uVar5;
  StackElem *pSVar6;
  ulong uVar7;
  PoolElem *pPVar8;
  XMLCh *pXVar9;
  XMLCh XVar10;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar11;
  
  if (this->fGlobalNamespaces == (StackElem *)0x0) {
    pSVar6 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    this->fGlobalNamespaces = pSVar6;
    pSVar6->fChildCapacity = 0;
    pSVar6->fChildCount = 0;
    pSVar6->fThisElement = (XMLElementDecl *)0x0;
    pSVar6->fMapCapacity = 0;
    pSVar6->fMapCount = 0;
    pSVar6->fChildren = (QName **)0x0;
    pSVar6->fMap = (PrefMapElem *)0x0;
    pSVar6->fSchemaElemName = (XMLCh *)0x0;
    pSVar6->fSchemaElemNameMaxLen = 0;
    pSVar6->fReaderNum = 0xffffffff;
    pSVar6->fValidationFlag = false;
    pSVar6->fCommentOrPISeen = false;
    pSVar6->fReferenceEscaped = false;
    pSVar6->fCurrentURI = this->fUnknownNamespaceId;
    pSVar6->fCurrentScope = 0xfffffffe;
    pSVar6->fCurrentGrammar = (Grammar *)0x0;
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar7 = (ulong)(ushort)*prefixToAdd, uVar7 == 0)) {
    uVar7 = 0;
  }
  else {
    XVar10 = prefixToAdd[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToAdd + 2;
      do {
        uVar7 = (ulong)(ushort)XVar10 + (uVar7 >> 0x18) + uVar7 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    uVar7 = uVar7 % pRVar1->fHashModulus;
  }
  pRVar11 = pRVar1->fBucketList[uVar7];
  if (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar11->fKey);
      if (bVar4) goto LAB_002a463d;
      pRVar11 = pRVar11->fNext;
    } while (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar11 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a463d:
  if (pRVar11 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar8 = (PoolElem *)0x0;
  }
  else {
    pPVar8 = pRVar11->fData;
  }
  if (pPVar8 == (PoolElem *)0x0) {
    uVar5 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
  }
  else {
    uVar5 = pPVar8->fId;
  }
  pSVar6 = this->fGlobalNamespaces;
  if (pSVar6->fMapCount == pSVar6->fMapCapacity) {
    expandMap(this,pSVar6);
  }
  pSVar6 = this->fGlobalNamespaces;
  pPVar2 = pSVar6->fMap;
  XVar3 = pSVar6->fMapCount;
  pPVar2[XVar3].fPrefId = uVar5;
  pPVar2[XVar3].fURIId = uriId;
  pSVar6->fMapCount = XVar3 + 1;
  return;
}

Assistant:

void ElemStack::addGlobalPrefix(const XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fGlobalNamespaces)
    {
        fGlobalNamespaces = new (fMemoryManager) StackElem;
        fGlobalNamespaces->fChildCapacity = 0;
        fGlobalNamespaces->fChildren = 0;
        fGlobalNamespaces->fMapCapacity = 0;
        fGlobalNamespaces->fMap = 0;
        fGlobalNamespaces->fMapCount = 0;
        fGlobalNamespaces->fSchemaElemName = 0;
        fGlobalNamespaces->fSchemaElemNameMaxLen = 0;
        fGlobalNamespaces->fThisElement = 0;
        fGlobalNamespaces->fReaderNum = 0xFFFFFFFF;
        fGlobalNamespaces->fChildCount = 0;
        fGlobalNamespaces->fValidationFlag = false;
        fGlobalNamespaces->fCommentOrPISeen = false;
        fGlobalNamespaces->fReferenceEscaped = false;
        fGlobalNamespaces->fCurrentURI = fUnknownNamespaceId;
        fGlobalNamespaces->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
        fGlobalNamespaces->fCurrentGrammar = 0;
    }

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (fGlobalNamespaces->fMapCount == fGlobalNamespaces->fMapCapacity)
        expandMap(fGlobalNamespaces);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = fEmptyNamespaceId;
    else
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = uriId;

    // Bump the map count now
    fGlobalNamespaces->fMapCount++;
}